

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall
aalcalc::outputresultscsv_new
          (aalcalc *this,vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_> *vec_aal)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer paVar5;
  double dVar6;
  char buffer [4096];
  char local_1038 [4104];
  
  for (paVar5 = (vec_aal->super__Vector_base<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>).
                _M_impl.super__Vector_impl_data._M_start;
      paVar5 != (vec_aal->super__Vector_base<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>).
                _M_impl.super__Vector_impl_data._M_finish; paVar5 = paVar5 + 1) {
    if (0 < (paVar5->super_aal_rec).summary_id) {
      iVar4 = (this->ensemblecount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[paVar5->ensemble_id];
      iVar2 = this->no_of_periods_;
      iVar3 = iVar2 * iVar4;
      dVar1 = (paVar5->super_aal_rec).mean;
      dVar6 = ((paVar5->super_aal_rec).mean_squared - (dVar1 * dVar1) / (double)iVar3) /
              (double)(iVar3 + -1);
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      iVar4 = sprintf(local_1038,"%d,%d,%f,%f,%d\n",(dVar1 / (double)iVar4) / (double)iVar2,dVar6,
                      (ulong)(uint)(paVar5->super_aal_rec).summary_id,
                      (ulong)(uint)(paVar5->super_aal_rec).type,(ulong)(uint)paVar5->ensemble_id);
      outputrows(this,local_1038,iVar4,_stdout);
    }
  }
  return;
}

Assistant:

void aalcalc::outputresultscsv_new(const std::vector<aal_rec_ensemble> &vec_aal)
{
	auto v_iter = vec_aal.begin();
	while (v_iter != vec_aal.end()) {

		if(v_iter->summary_id > 0) {

			int sample_size = ensemblecount_[v_iter->ensemble_id];
			int p1 = no_of_periods_ * sample_size;
			int p2 = p1 - 1;
			double mean, sd_dev;
			calculatemeansddev(*v_iter, sample_size, p1, p2,
					   no_of_periods_, mean, sd_dev);

			char buffer[4096];
			int strLen;
			strLen = sprintf(buffer, "%d,%d,%f,%f,%d\n",
					v_iter->summary_id, v_iter->type,
					mean, sd_dev, v_iter->ensemble_id);
			outputrows(buffer, strLen);

		}

		v_iter++;

	}
}